

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O0

void jessilib::impl_join::
     join_append<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>&>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out_string,
               basic_string_view<char,_std::char_traits<char>_> *in_string,
               basic_string_view<char,_std::char_traits<char>_> *in_args,
               basic_string_view<char,_std::char_traits<char>_> *in_args_1)

{
  basic_string_view<char,_std::char_traits<char>_> *in_args_local_1;
  basic_string_view<char,_std::char_traits<char>_> *in_args_local;
  basic_string_view<char,_std::char_traits<char>_> *in_string_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out_string_local;
  
  std::__cxx11::string::operator+=((string *)out_string,in_string);
  join_append<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>&>
            (out_string,in_args,in_args_1);
  return;
}

Assistant:

constexpr void join_append(OutT& out_string, InT&& in_string, ArgsT&&... in_args) {
	using InCharT = typename std::remove_cvref_t<InT>::value_type;
	if constexpr (std::is_same_v<typename std::remove_cvref_t<OutT>::value_type, InCharT>) {
		// Join these straight together
		out_string += std::forward<InT>(in_string);
	}
	else {
		// Append over all the codepoints
		decode_result decode;
		std::basic_string_view<InCharT> in_view = in_string;
		while ((decode = decode_codepoint(in_view)).units != 0) {
			encode_codepoint(out_string, decode.codepoint);
			in_view.remove_prefix(decode.units);
		}
	}

	join_append(out_string, std::forward<ArgsT>(in_args)...);
}